

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O0

int __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::get_infohashes_sample
          (dht_default_storage *this,entry *item)

{
  int iVar1;
  int *piVar2;
  entry *peVar3;
  size_type sVar4;
  digest32<160L> *p;
  size_type sVar5;
  string_view local_68;
  span<const_char> local_58;
  infohashes_sample *local_48;
  vector<sha1_hash> *samples;
  string_view local_30;
  int local_20;
  int local_1c;
  entry *local_18;
  entry *item_local;
  dht_default_storage *this_local;
  
  local_18 = item;
  item_local = (entry *)this;
  local_1c = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4093);
  local_20 = 0;
  piVar2 = ::std::clamp<int>(&local_1c,&local_20,
                             &(anonymous_namespace)::sample_infohashes_interval_max);
  peVar3 = local_18;
  iVar1 = *piVar2;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"interval");
  peVar3 = entry::operator[](peVar3,local_30);
  entry::operator=(peVar3,(long)iVar1);
  sVar4 = ::std::
          map<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::torrent_entry,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::torrent_entry>_>_>
          ::size(&this->m_map);
  peVar3 = local_18;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&samples,"num");
  peVar3 = entry::operator[](peVar3,_samples);
  entry::operator=(peVar3,(long)(int)sVar4);
  refresh_infohashes_sample(this);
  local_48 = &this->m_infohashes_sample;
  p = ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::data
                ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *
                 )local_48);
  sVar5 = ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
          size((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
               local_48);
  span<const_char>::span(&local_58,(char *)p,sVar5 * 0x14);
  peVar3 = local_18;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"samples");
  peVar3 = entry::operator[](peVar3,local_68);
  entry::operator=(peVar3,local_58);
  iVar1 = infohashes_sample::count(&this->m_infohashes_sample);
  return iVar1;
}

Assistant:

int get_infohashes_sample(entry& item) override
		{
			item["interval"] = std::clamp(m_settings.get_int(settings_pack::dht_sample_infohashes_interval)
				, 0, sample_infohashes_interval_max);
			item["num"] = int(m_map.size());

			refresh_infohashes_sample();

			aux::vector<sha1_hash> const& samples = m_infohashes_sample.samples;
			item["samples"] = span<char const>(
				reinterpret_cast<char const*>(samples.data()), static_cast<std::ptrdiff_t>(samples.size()) * 20);

			return m_infohashes_sample.count();
		}